

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_assign_initializer_list(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  ulong uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  int local_48 [4];
  type local_38 [4];
  circular_view<int,_18446744073709551615UL> local_28;
  
  local_28.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.member.cap = 4;
  local_28.member.size = 0;
  local_28.member.next = 4;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input._M_len = 5;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_28,input);
  local_48[0] = 0x16;
  local_48[1] = 0x21;
  local_48[2] = 0x2c;
  local_48[3] = 0x37;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_79);
  uVar1 = local_28.member.cap * 2;
  if ((uVar1 & local_28.member.cap * 2 - 1) == 0) {
    uVar2 = local_28.member.next - local_28.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_28.member.next;
  }
  else {
    uVar2 = (local_28.member.next - local_28.member.size) % uVar1;
    sStack_50 = local_28.member.next % uVar1;
  }
  first_end.current = sStack_50;
  first_end.parent = &local_28;
  first_begin.current = uVar2;
  first_begin.parent = &local_28;
  local_58 = &local_28;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,300,"void api_dynamic_suite::dynamic_assign_initializer_list()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_assign_initializer_list()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.assign({ 11, 22, 33, 44, 55 });
    {
        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}